

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  FuncDesc *pFVar2;
  pointer pTVar3;
  pointer pMVar4;
  pointer pGVar5;
  EventType *pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pDVar9;
  ElemSegment *pEVar10;
  ElemDesc *pEVar11;
  DataSegment *pDVar12;
  DataDesc *pDVar13;
  pointer pSVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  u32 uVar18;
  Result RVar19;
  ulong uVar20;
  long lVar21;
  Ref instance;
  pointer pRVar22;
  pointer pRVar23;
  uint uVar24;
  FuncDesc *desc;
  FuncDesc *pFVar25;
  pointer pGVar26;
  EventType *pEVar27;
  ulong uVar28;
  ElemSegment *src;
  Instance *store_00;
  RefVec *pRVar29;
  pointer pSVar30;
  ExportDesc *desc_5;
  long lVar31;
  pointer pEVar32;
  pointer pDVar33;
  DataSegment *src_00;
  TableDesc *desc_1;
  pointer pTVar34;
  pointer pMVar35;
  pointer pEVar36;
  Ptr inst;
  Ptr table;
  Ptr extern_;
  Ptr mod;
  Ref extern_ref;
  Ptr local_168;
  RefVec *local_148;
  GlobalType local_140;
  anon_union_16_6_113bff37_for_Value_0 local_128;
  Index local_118;
  Ref module_local;
  MemoryType local_108;
  TableType local_e0;
  EventType local_b8;
  FuncDesc local_90;
  
  module_local = module;
  RefPtr<wabt::interp::Module>::RefPtr(&mod,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&inst,store,store,&module_local);
  uVar20 = ((long)((mod.obj_)->desc_).imports.
                  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)((mod.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  local_148 = imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar20) {
    std::__cxx11::string::string((string *)&extern_,"not enough imports!",(allocator *)&extern_ref);
    local_168.obj_ = (Trap *)0x0;
    local_168.store_ = (Store *)0x0;
    local_168.root_index_ = 0;
    Trap::New((Ptr *)&table,store,(string *)&extern_,
              (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168);
    out_trap->obj_ = (Trap *)table.obj_;
    out_trap->store_ = table.store_;
    out_trap->root_index_ = table.root_index_;
    table.obj_ = (Table *)0x0;
    table.store_ = (Store *)0x0;
    table.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&table);
    std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168
              );
    std::__cxx11::string::_M_dispose();
LAB_002559b1:
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
  }
  else {
    lVar31 = 0;
    uVar28 = 0;
    while (uVar20 != uVar28) {
      pIVar1 = ((mod.obj_)->desc_).imports.
               super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      extern_ref.index =
           (local_148->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
           _M_impl.super__Vector_impl_data._M_start[uVar28].index;
      if (extern_ref.index == 0) {
        StringPrintf_abi_cxx11_
                  ((string *)&extern_,"invalid import \"%s.%s\"",
                   *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus._M_p + lVar31),
                   *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus._M_p + lVar31));
        local_168.obj_ = (Trap *)0x0;
        local_168.store_ = (Store *)0x0;
        local_168.root_index_ = 0;
        Trap::New((Ptr *)&table,store,(string *)&extern_,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168);
        out_trap->obj_ = (Trap *)table.obj_;
        out_trap->store_ = table.store_;
        out_trap->root_index_ = table.root_index_;
        table.obj_ = (Table *)0x0;
        table.store_ = (Store *)0x0;
        table.root_index_ = 0;
        RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&table);
        std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
                  ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &local_168);
        std::__cxx11::string::_M_dispose();
        goto LAB_002559b1;
      }
      RefPtr<wabt::interp::Extern>::RefPtr(&extern_,store,extern_ref);
      iVar17 = (*((extern_.obj_)->super_Object)._vptr_Object[3])
                         (extern_.obj_,store,(long)&(pIVar1->type).module._M_dataplus._M_p + lVar31,
                          out_trap);
      if (iVar17 == 1) {
        __return_storage_ptr__->obj_ = (Instance *)0x0;
        __return_storage_ptr__->store_ = (Store *)0x0;
        __return_storage_ptr__->root_index_ = 0;
        goto switchD_0025524d_default;
      }
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->imports_,&extern_ref);
      switch(*(undefined4 *)
              (*(long *)((long)&(pIVar1->type).type._M_t.
                                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>.
                                _M_head_impl + lVar31) + 8)) {
      case 0:
        pRVar29 = &(inst.obj_)->funcs_;
        goto LAB_0025528a;
      case 1:
        pRVar29 = &(inst.obj_)->tables_;
        goto LAB_0025528a;
      case 2:
        lVar21 = 0x90;
        break;
      case 3:
        lVar21 = 0xa8;
        break;
      case 4:
        lVar21 = 0xc0;
        break;
      default:
        goto switchD_0025524d_default;
      }
      pRVar29 = (RefVec *)((long)&((inst.obj_)->super_Object)._vptr_Object + lVar21);
LAB_0025528a:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (pRVar29,&extern_ref);
switchD_0025524d_default:
      RefPtr<wabt::interp::Extern>::reset(&extern_);
      uVar28 = uVar28 + 1;
      lVar31 = lVar31 + 0x48;
      if (iVar17 == 1) goto LAB_002559bd;
    }
    pFVar2 = ((mod.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pFVar25 = ((mod.obj_)->desc_).funcs.
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar25 != pFVar2;
        pFVar25 = pFVar25 + 1) {
      pRVar29 = &(inst.obj_)->funcs_;
      instance = RefPtr<wabt::interp::Instance>::ref(&inst);
      FuncDesc::FuncDesc(&local_90,pFVar25);
      DefinedFunc::New((Ptr *)&extern_,store,instance,&local_90);
      table.obj_ = (Table *)RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar29,(Ref *)&table);
      RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
      FuncDesc::~FuncDesc(&local_90);
    }
    pTVar3 = ((mod.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar34 = ((mod.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar34 != pTVar3;
        pTVar34 = pTVar34 + 1) {
      pRVar29 = &(inst.obj_)->tables_;
      local_e0.super_ExternType.kind = (pTVar34->type).super_ExternType.kind;
      local_e0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002f3b10;
      local_e0.limits._12_7_ =
           SUB87((ulong)*(undefined8 *)((long)&(pTVar34->type).limits.max + 3) >> 8,0);
      local_e0._12_8_ = *(undefined8 *)&(pTVar34->type).super_ExternType.field_0xc;
      uVar15 = *(undefined8 *)((long)&(pTVar34->type).limits.initial + 4);
      local_e0.limits._4_7_ = SUB87(uVar15,0);
      local_e0.limits.max._3_1_ = (undefined1)((ulong)uVar15 >> 0x38);
      Table::New((Ptr *)&extern_,store,&local_e0);
      table.obj_ = (Table *)RefPtr<wabt::interp::Table>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar29,(Ref *)&table);
      RefPtr<wabt::interp::Table>::reset((Ptr *)&extern_);
    }
    pMVar4 = ((mod.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar35 = ((mod.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar35 != pMVar4;
        pMVar35 = pMVar35 + 1) {
      pRVar29 = &(inst.obj_)->memories_;
      local_108.super_ExternType.kind = (pMVar35->type).super_ExternType.kind;
      local_108.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002f3b50;
      local_108.limits.has_max = (pMVar35->type).limits.has_max;
      local_108.limits.is_shared = (pMVar35->type).limits.is_shared;
      local_108.limits.is_64 = (pMVar35->type).limits.is_64;
      local_108.limits._19_5_ = *(undefined5 *)&(pMVar35->type).limits.field_0x13;
      local_108.limits.initial = (pMVar35->type).limits.initial;
      local_108.limits.max = (pMVar35->type).limits.max;
      Memory::New((Ptr *)&extern_,store,&local_108);
      table.obj_ = (Table *)RefPtr<wabt::interp::Memory>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar29,(Ref *)&table);
      RefPtr<wabt::interp::Memory>::reset((Ptr *)&extern_);
    }
    pGVar5 = ((mod.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pGVar26 = ((mod.obj_)->desc_).globals.
                   super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pGVar26 != pGVar5;
        pGVar26 = pGVar26 + 1) {
      pRVar29 = &(inst.obj_)->globals_;
      local_140.super_ExternType.kind = (pGVar26->type).super_ExternType.kind;
      local_140.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002f3b90;
      local_140._12_8_ = *(undefined8 *)&(pGVar26->type).super_ExternType.field_0xc;
      ResolveInitExpr((Value *)&local_128.v128_,inst.obj_,store,pGVar26->init);
      extern_.root_index_ = local_118;
      extern_.obj_ = (Extern *)local_128.i64_;
      extern_.store_ = (Store *)local_128._8_8_;
      Store::
      Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                ((RefPtr<wabt::interp::Global> *)&table,store,store,&local_140,(Value *)&extern_);
      extern_.obj_ = (Extern *)
                     RefPtr<wabt::interp::Global>::ref((RefPtr<wabt::interp::Global> *)&table);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar29,(Ref *)&extern_);
      RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&table);
    }
    pEVar6 = &(((mod.obj_)->desc_).events.
               super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish)->type;
    for (pEVar27 = &(((mod.obj_)->desc_).events.
                     super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type; pEVar27 != pEVar6;
        pEVar27 = pEVar27 + 1) {
      pRVar29 = &(inst.obj_)->events_;
      EventType::EventType(&local_b8,pEVar27);
      Event::New((Ptr *)&extern_,store,&local_b8);
      table.obj_ = (Table *)RefPtr<wabt::interp::Event>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar29,(Ref *)&table);
      RefPtr<wabt::interp::Event>::reset((Ptr *)&extern_);
      EventType::~EventType(&local_b8);
    }
    pEVar7 = ((mod.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pEVar32 = ((mod.obj_)->desc_).exports.
                   super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar32 != pEVar7;
        pEVar32 = pEVar32 + 1) {
      switch(((pEVar32->type).type._M_t.
              super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
              .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
      case First:
        uVar20 = (ulong)pEVar32->index;
        pRVar22 = ((inst.obj_)->funcs_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Table:
        uVar20 = (ulong)pEVar32->index;
        pRVar22 = ((inst.obj_)->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Memory:
        uVar20 = (ulong)pEVar32->index;
        pRVar22 = ((inst.obj_)->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Global:
        uVar20 = (ulong)pEVar32->index;
        pRVar22 = ((inst.obj_)->globals_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Event:
        uVar20 = (ulong)pEVar32->index;
        pRVar22 = ((inst.obj_)->events_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      default:
        goto switchD_00255613_default;
      }
      extern_.obj_ = (Extern *)pRVar22[uVar20].index;
switchD_00255613_default:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->exports_,(value_type *)&extern_);
    }
    pEVar8 = ((mod.obj_)->desc_).elems.
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pEVar36 = ((mod.obj_)->desc_).elems.
                   super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar36 != pEVar8;
        pEVar36 = pEVar36 + 1) {
      extern_.obj_ = (Extern *)pEVar36;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &(inst.obj_)->elems_,(ElemDesc **)&extern_,&inst);
    }
    pDVar9 = ((mod.obj_)->desc_).datas.
             super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar33 = ((mod.obj_)->desc_).datas.
                   super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar33 != pDVar9;
        pDVar33 = pDVar33 + 1) {
      extern_.obj_ = (Extern *)pDVar33;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &(inst.obj_)->datas_,(DataDesc **)&extern_);
    }
    for (uVar24 = (uint)(store->features_).bulk_memory_enabled_; uVar24 != 2; uVar24 = uVar24 + 1) {
      pEVar10 = ((inst.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((inst.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar10; src = src + 1) {
        pEVar11 = src->desc_;
        if (pEVar11->mode == Declared) {
          pRVar22 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar22) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar22;
          }
        }
        else if (pEVar11->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    (&table,store,
                     (Ref)((inst.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar11->table_index].index);
          store_00 = inst.obj_;
          ResolveInitExpr((Value *)&extern_,inst.obj_,store,pEVar11->offset);
          uVar18 = Value::Get<unsigned_int>((Value *)&extern_);
          pRVar22 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar23 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = (ulong)((long)pRVar23 - (long)pRVar22) >> 3;
          if (uVar24 == 0) {
            uVar28 = (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar20 = uVar20 & 0xffffffff;
            RVar19.enum_ = (Enum)(uVar28 - uVar20 < (ulong)uVar18 || uVar28 < uVar20);
          }
          else {
            RVar19 = Table::Init(table.obj_,(Store *)store_00,uVar18,src,0,(u32)uVar20);
            pRVar22 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pRVar23 = pRVar22;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar22) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar22;
            }
          }
          if (RVar19.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((string *)&extern_,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,(ulong)uVar18,
                       ((ulong)((long)pRVar23 - (long)pRVar22) >> 3 & 0xffffffff) + (ulong)uVar18,
                       (ulong)((long)((table.obj_)->elements_).
                                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)((table.obj_)->elements_).
                                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
            extern_ref.index = 0;
            Trap::New(&local_168,store,(string *)&extern_,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &extern_ref);
            out_trap->obj_ = local_168.obj_;
            out_trap->store_ = local_168.store_;
            out_trap->root_index_ = local_168.root_index_;
            local_168.obj_ = (Trap *)0x0;
            local_168.store_ = (Store *)0x0;
            local_168.root_index_ = 0;
            RefPtr<wabt::interp::Trap>::reset(&local_168);
            std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
            ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *
                          )&extern_ref);
            std::__cxx11::string::_M_dispose();
            __return_storage_ptr__->obj_ = (Instance *)0x0;
            __return_storage_ptr__->store_ = (Store *)0x0;
            __return_storage_ptr__->root_index_ = 0;
            RefPtr<wabt::interp::Table>::reset(&table);
            goto LAB_002559bd;
          }
          RefPtr<wabt::interp::Table>::reset(&table);
        }
      }
      pDVar12 = ((inst.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((inst.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar12;
          src_00 = src_00 + 1) {
        pDVar13 = src_00->desc_;
        if (pDVar13->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar13->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&table,store,
                     (Ref)((inst.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar13->memory_index].index);
          ResolveInitExpr((Value *)&extern_,inst.obj_,store,pDVar13->offset);
          uVar18 = Value::Get<unsigned_int>((Value *)&extern_);
          uVar20 = (ulong)uVar18;
          if (uVar24 == 0) {
            bVar16 = Memory::IsValidAccess((Memory *)table.obj_,uVar20,0,src_00->size_);
            if (bVar16) goto LAB_00255900;
          }
          else {
            RVar19 = Memory::Init((Memory *)table.obj_,uVar20,src_00,0,src_00->size_);
            src_00->size_ = 0;
            if (RVar19.enum_ != Error) {
LAB_00255900:
              RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&table);
              goto LAB_00255912;
            }
          }
          StringPrintf_abi_cxx11_
                    ((string *)&extern_,
                     "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %lu"
                     ,uVar20,uVar20 + src_00->size_,
                     (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((table.obj_)->elements_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          extern_ref.index = 0;
          Trap::New(&local_168,store,(string *)&extern_,
                    (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&extern_ref
                   );
          out_trap->obj_ = local_168.obj_;
          out_trap->store_ = local_168.store_;
          out_trap->root_index_ = local_168.root_index_;
          local_168.obj_ = (Trap *)0x0;
          local_168.store_ = (Store *)0x0;
          local_168.root_index_ = 0;
          RefPtr<wabt::interp::Trap>::reset(&local_168);
          std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
          ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &extern_ref);
          std::__cxx11::string::_M_dispose();
          __return_storage_ptr__->obj_ = (Instance *)0x0;
          __return_storage_ptr__->store_ = (Store *)0x0;
          __return_storage_ptr__->root_index_ = 0;
          RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&table);
          goto LAB_002559bd;
        }
LAB_00255912:
      }
    }
    pSVar30 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar14 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pSVar30 == pSVar14) {
        __return_storage_ptr__->obj_ = inst.obj_;
        __return_storage_ptr__->store_ = inst.store_;
        __return_storage_ptr__->root_index_ = inst.root_index_;
        inst.obj_ = (Instance *)0x0;
        inst.store_ = (Store *)0x0;
        inst.root_index_ = 0;
        goto LAB_002559bd;
      }
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)&extern_,store,
                 (Ref)((inst.obj_)->funcs_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[pSVar30->func_index].index);
      table.obj_ = (Table *)0x0;
      table.store_ = (Store *)0x0;
      table.root_index_ = 0;
      local_168.obj_ = (Trap *)0x0;
      local_168.store_ = (Store *)0x0;
      local_168.root_index_ = 0;
      RVar19 = Func::Call((Func *)extern_.obj_,store,(Values *)&local_168,(Values *)&table,out_trap,
                          (Stream *)0x0);
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                 &local_168);
      if (RVar19.enum_ == Error) break;
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&table);
      RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
      pSVar30 = pSVar30 + 1;
    }
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
    std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&table);
    RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
  }
LAB_002559bd:
  RefPtr<wabt::interp::Instance>::reset(&inst);
  RefPtr<wabt::interp::Module>::reset(&mod);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %"
                           PRIu64, offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}